

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ler.c
# Opt level: O0

int errfmt(char *outbuf,int outbufl,char *fmt,int argc,erradef *argv)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  int in_ECX;
  char *in_RDX;
  int in_ESI;
  undefined1 *in_RDI;
  long in_R8;
  char fmtchar;
  char *p;
  char buf [20];
  int len;
  int argi;
  int outlen;
  char local_51;
  char *local_50;
  char local_48 [20];
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  int local_1c;
  char *local_18;
  int local_c;
  undefined1 *local_8;
  
  local_2c = 0;
  local_30 = 0;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_18 = in_RDX; *local_18 != '\0' && 1 < local_c; local_18 = local_18 + 1) {
    if (*local_18 == '%') {
      pcVar2 = local_18 + 1;
      local_51 = *pcVar2;
      if (local_1c <= local_30) {
        local_51 = '\x01';
      }
      if (local_51 == '\0') {
        local_34 = 0;
      }
      else {
        local_18 = pcVar2;
        if (local_51 == '%') {
          local_50 = "%";
          local_34 = 1;
        }
        else if (local_51 == 'd') {
          sprintf(local_48,"%d",(ulong)*(uint *)(local_28 + (long)local_30 * 8));
          sVar3 = strlen(local_48);
          local_34 = (int)sVar3;
          local_50 = local_48;
        }
        else if (local_51 == 's') {
          local_50 = *(char **)(local_28 + (long)local_30 * 8);
          sVar3 = strlen(local_50);
          local_34 = (int)sVar3;
        }
        else if (local_51 == 'u') {
          sprintf(local_48,"%u",(ulong)*(uint *)(local_28 + (long)local_30 * 8));
          sVar3 = strlen(local_48);
          local_34 = (int)sVar3;
          local_50 = local_48;
        }
        else {
          local_50 = "";
          local_34 = 0;
          local_30 = local_30 + -1;
        }
      }
      local_30 = local_30 + 1;
    }
    else if (*local_18 == '\\') {
      pcVar2 = local_18 + 1;
      local_34 = 1;
      cVar1 = *pcVar2;
      if (cVar1 != '\0') {
        local_18 = pcVar2;
        if (cVar1 == '\t') {
          local_50 = "\t";
        }
        else {
          local_50 = pcVar2;
          if (cVar1 == '\n') {
            local_50 = "\n";
          }
        }
      }
    }
    else {
      local_50 = local_18;
      local_34 = 1;
    }
    if (local_34 != 0) {
      if (local_c < local_34) {
        if (1 < local_c) {
          memcpy(local_8,local_50,(long)local_c - 1);
          local_c = 1;
        }
      }
      else {
        memcpy(local_8,local_50,(long)local_34);
        local_c = local_c - local_34;
        local_8 = local_8 + local_34;
      }
      local_2c = local_34 + local_2c;
    }
  }
  if (local_c != 0) {
    *local_8 = 0;
  }
  return local_2c;
}

Assistant:

int errfmt(char *outbuf, int outbufl, char *fmt, int argc, erradef *argv)
{
    int    outlen = 0;
    int    argi   = 0;
    int    len;
    char   buf[20];
    char  *p;
    char   fmtchar;

    while (*fmt != '\0' && outbufl > 1)
    {
        switch(*fmt)
        {
        case '\\':
            ++fmt;
            len = 1;
            switch(*fmt)
            {
            case '\0':
                --fmt;
                break;
            case '\n':
                p = "\n";
                break;
            case '\t':
                p = "\t";
                break;
            default:
                p = fmt;
                break;
            }
            break;
            
        case '%':
            ++fmt;
            fmtchar = *fmt;
            if (argi >= argc) fmtchar = 1;          /* too many - ignore it */
            switch(fmtchar)
            {
            case '\0':
                --fmt;
                len = 0;
                break;
                
            case '%':
                p = "%";
                len = 1;
                break;
                
            case 'd':
                sprintf(buf, "%d", argv[argi].erraint);
                len = strlen(buf);
                p = buf;
                break;
                
            case 'u':
                sprintf(buf, "%u", argv[argi].erraint);
                len = strlen(buf);
                p = buf;
                break;
                
            case 's':
                p = argv[argi].errastr;
                len = strlen(p);
                break;
                
            default:
                p = "";
                len = 0;
                --argi;
                break;
            }
            ++argi;
            break;
            
        default:
            p = fmt;
            len = 1;
            break;
        }

        /* copy output that was set up above */
        if (len != 0)
        {
            if (outbufl >= len)
            {
                memcpy(outbuf, p, (size_t)len);
                outbufl -= len;
                outbuf += len;
            }
            else if (outbufl > 1)
            {
                memcpy(outbuf, p, (size_t)outbufl - 1);
                outbufl = 1;
            }
            outlen += len;
        }
        ++fmt;
    }

    /* add a null terminator */
    if (outbufl != 0)
        *outbuf++ = '\0';

    /* return the length */
    return outlen;
}